

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_array_suite.cpp
# Opt level: O1

ostream * std::operator<<(ostream *stream,
                         pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *data)

{
  ostream *poVar1;
  char local_13;
  char local_12;
  char local_11;
  
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(stream,&local_13,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(data->first)._M_dataplus._M_p,(data->first)._M_string_length);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_12,1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(data->second)._M_dataplus._M_p,(data->second)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, const vista::pair<Key, T>& data)
{
    stream << '{' << data.first << ',' << data.second << '}';
    return stream;
}